

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Signal_PDU::Decode(Signal_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer *ppcVar1;
  iterator __position;
  ushort uVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  short sVar5;
  KOCTET o;
  KString local_48;
  ushort uVar6;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x1f < iVar4 + (uint)KVar3) {
    Radio_Communications_Header::Decode
              (&this->super_Radio_Communications_Header,stream,ignoreHeader);
    (*(this->m_EncodingScheme).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EncodingScheme,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32SampleRate);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16DataLength);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Samples);
    uVar2 = this->m_ui16DataLength >> 3;
    uVar6 = 4 - (uVar2 & 3);
    if ((uVar2 & 3) == 0) {
      uVar6 = uVar2 & 3;
    }
    sVar5 = uVar6 + uVar2;
    if (sVar5 != 0) {
      do {
        KDataStream::Read(stream,(KOCTET *)&local_48);
        __position._M_current =
             (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->m_vData,__position,
                     (char *)&local_48);
        }
        else {
          *__position._M_current = (char)local_48._M_dataplus._M_p;
          ppcVar1 = &(this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        sVar5 = sVar5 + -1;
      } while (sVar5 != 0);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode","");
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Signal_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SIGNAL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EncodingScheme
           >> m_ui32SampleRate
           >> m_ui16DataLength
           >> m_ui16Samples;

    KUINT16 dl =  m_ui16DataLength / 8;
    dl += ( dl % 4 == 0 ? 0 : ( 4 - dl % 4 ) ); // Add padding
    for( KUINT16 i = 0; i < dl; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vData.push_back( o );
    }
}